

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  uint uVar1;
  U16 UVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  int in_ECX;
  byte *pbVar8;
  int in_EDX;
  byte *in_RSI;
  byte *in_RDI;
  int in_R8D;
  long in_R9;
  ulong in_stack_00000008;
  BYTE *oCopyLimit;
  BYTE *copyEnd;
  BYTE *matchEnd;
  size_t mlen;
  BYTE *copyFrom_1;
  BYTE *endOfMatch_1;
  size_t restSize_1;
  size_t copySize_1;
  size_t addl_3;
  size_t addl_2;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t restSize;
  size_t copySize;
  size_t addl_1;
  size_t addl;
  size_t length;
  uint token;
  size_t offset;
  BYTE *match;
  BYTE *shortoend;
  BYTE *shortiend;
  int checkOffset;
  BYTE *dictEnd;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  BYTE *e_4;
  BYTE *s_8;
  BYTE *d_4;
  BYTE *e_5;
  BYTE *s_9;
  BYTE *d_5;
  BYTE *e_3;
  BYTE *s_6;
  BYTE *d_3;
  Rvl_t length_1;
  Rvl_t s;
  Rvl_t length_2;
  Rvl_t s_2;
  Rvl_t length_4;
  Rvl_t s_7;
  Rvl_t length_3;
  Rvl_t s_5;
  BYTE *e;
  BYTE *s_1;
  BYTE *d;
  BYTE *e_2;
  BYTE *s_4;
  BYTE *d_2;
  BYTE v [8];
  BYTE *e_1;
  BYTE *s_3;
  BYTE *d_1;
  void *in_stack_fffffffffffffc48;
  size_t local_3b0;
  ulong local_3a8;
  ulong local_398;
  long local_388;
  int local_37c;
  byte *local_330;
  byte *local_300;
  ulong local_2d0;
  uint local_2c4;
  ulong local_2c0;
  byte *local_2b8;
  byte *local_290;
  byte *local_280;
  byte *local_270;
  ulong local_268;
  byte *local_258;
  int local_250;
  int local_24c;
  int local_248;
  byte *local_240;
  byte *local_238;
  int local_22c;
  byte *local_228;
  byte *local_220;
  byte *local_218;
  byte *local_210;
  byte *local_208;
  byte *local_200;
  byte *local_1f8;
  byte *local_1f0;
  byte *local_1e8;
  byte *local_1e0;
  byte *local_1d8;
  byte *local_1d0;
  byte *local_1c8;
  byte *local_1c0;
  byte *local_1b8;
  byte *local_1b0;
  byte *local_1a8;
  byte *local_1a0;
  ulong local_198;
  ulong local_190;
  undefined4 local_184;
  byte *local_180;
  byte **local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  undefined4 local_154;
  byte *local_150;
  byte **local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  undefined4 local_124;
  byte *local_120;
  byte **local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  undefined4 local_f4;
  byte *local_f0;
  byte **local_e8;
  ulong local_e0;
  byte *local_d8;
  byte *local_d0;
  byte *local_c8;
  byte *local_c0;
  byte *local_b8;
  byte *local_b0;
  byte *local_a8;
  byte *local_a0;
  byte *local_98;
  byte *local_90;
  byte *local_88;
  byte *local_80;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined4 uStack_74;
  ulong local_70;
  byte *local_68;
  byte *local_60;
  byte *local_58;
  ulong local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  byte *local_30;
  byte *local_28;
  byte *local_20;
  byte *local_18;
  byte *local_10;
  byte *local_8;
  
  local_37c = in_R8D;
  if (in_ECX < in_R8D) {
    local_37c = in_ECX;
  }
  local_248 = local_37c;
  local_24c = 1;
  local_250 = 2;
  local_268 = in_stack_00000008;
  if ((in_RDI == (byte *)0x0) || (local_37c < 0)) {
    local_22c = -1;
  }
  else {
    pbVar3 = in_RDI + in_EDX;
    pbVar4 = in_RSI + local_37c;
    if (in_R9 == 0) {
      local_388 = 0;
    }
    else {
      local_388 = in_R9 + in_stack_00000008;
    }
    if (local_37c == 0) {
      local_22c = 0;
    }
    else if (in_EDX == 0) {
      local_22c = -1;
    }
    else {
      local_280 = in_RSI;
      pbVar8 = in_RSI;
      local_270 = in_RDI;
      local_258 = in_RSI;
      local_240 = in_RSI;
      local_238 = in_RDI;
      if (0x3f < (long)pbVar4 - (long)in_RSI) {
LAB_00219ac9:
        do {
          pbVar8 = local_270 + 1;
          local_2c4 = (uint)*local_270;
          local_2d0 = (ulong)(*local_270 >> 4);
          if (local_2d0 == 0xf) {
            local_180 = pbVar3 + -0xf;
            local_178 = &local_270;
            local_184 = 1;
            local_198 = 0;
            if (pbVar8 < local_180) {
              local_198 = (ulong)*pbVar8;
              local_270 = local_270 + 2;
              local_190 = local_198;
              if (local_180 < local_270) {
                local_170 = 0xffffffffffffffff;
              }
              else {
                local_170 = local_198;
                if (local_198 == 0xff) {
                  local_198 = 0xff;
                  do {
                    local_190 = (ulong)**local_178;
                    *local_178 = *local_178 + 1;
                    local_198 = local_190 + local_198;
                    if (local_180 < *local_178) {
                      local_170 = 0xffffffffffffffff;
                      break;
                    }
                    local_170 = local_198;
                  } while (local_190 == 0xff);
                }
              }
            }
            else {
              local_170 = 0xffffffffffffffff;
              local_270 = pbVar8;
            }
            if (((local_170 == 0xffffffffffffffff) ||
                (local_2d0 = local_170 + 0xf, local_280 + local_2d0 < local_280)) ||
               (local_270 + local_2d0 < local_270)) goto LAB_0021ba4c;
            pbVar8 = local_270;
            if (pbVar4 + -0x20 < local_280 + local_2d0) goto LAB_0021ad96;
            if (pbVar3 + -0x20 < local_270 + local_2d0) goto LAB_0021ad96;
            local_d8 = local_280 + local_2d0;
            local_b0 = local_280;
            local_b8 = local_270;
            local_c8 = local_280;
            local_d0 = local_270;
            do {
              *(undefined8 *)local_c8 = *(undefined8 *)local_d0;
              *(undefined8 *)(local_c8 + 8) = *(undefined8 *)(local_d0 + 8);
              *(undefined8 *)(local_c8 + 0x10) = *(undefined8 *)(local_d0 + 0x10);
              *(undefined8 *)(local_c8 + 0x18) = *(undefined8 *)(local_d0 + 0x18);
              local_c8 = local_c8 + 0x20;
              local_d0 = local_d0 + 0x20;
            } while (local_c8 < local_d8);
            local_270 = local_270 + local_2d0;
            local_c0 = local_d8;
          }
          else {
            if (pbVar3 + -0x11 < pbVar8) goto LAB_0021ad96;
            *(undefined8 *)local_280 = *(undefined8 *)pbVar8;
            *(undefined8 *)(local_280 + 8) = *(undefined8 *)(local_270 + 9);
            local_270 = pbVar8 + local_2d0;
          }
          local_280 = local_280 + local_2d0;
          UVar2 = LZ4_readLE16(in_stack_fffffffffffffc48);
          local_2c0 = (ulong)UVar2;
          pbVar8 = local_270 + 2;
          local_2b8 = local_280 + -local_2c0;
          if ((ulong)(local_2c4 & 0xf) == 0xf) {
            local_150 = pbVar3 + -4;
            local_148 = &local_270;
            local_154 = 0;
            local_168 = (ulong)*pbVar8;
            local_270 = local_270 + 3;
            local_160 = local_168;
            if (local_150 < local_270) {
              local_140 = 0xffffffffffffffff;
            }
            else {
              local_140 = local_168;
              if (local_168 == 0xff) {
                local_168 = 0xff;
                do {
                  local_160 = (ulong)**local_148;
                  *local_148 = *local_148 + 1;
                  local_168 = local_160 + local_168;
                  if (local_150 < *local_148) {
                    local_140 = 0xffffffffffffffff;
                    break;
                  }
                  local_140 = local_168;
                } while (local_160 == 0xff);
              }
            }
            if ((local_140 == 0xffffffffffffffff) ||
               (local_2d0 = local_140 + 0x13, local_280 + local_2d0 < local_280)) goto LAB_0021ba4c;
            if (pbVar4 + -0x40 <= local_280 + local_2d0) goto LAB_0021b297;
          }
          else {
            local_2d0 = (ulong)(local_2c4 & 0xf) + 4;
            local_270 = pbVar8;
            if (pbVar4 + -0x40 <= local_280 + local_2d0) goto LAB_0021b297;
            if (((local_250 == 1) || (local_258 <= local_2b8)) && (7 < local_2c0)) {
              *(undefined8 *)local_280 = *(undefined8 *)local_2b8;
              *(undefined8 *)(local_280 + 8) = *(undefined8 *)(local_2b8 + 8);
              *(undefined2 *)(local_280 + 0x10) = *(undefined2 *)(local_2b8 + 0x10);
              local_280 = local_280 + local_2d0;
              goto LAB_00219ac9;
            }
          }
          if ((in_stack_00000008 < 0x10000) && (local_2b8 + local_268 < local_258))
          goto LAB_0021ba4c;
          if ((local_250 != 2) || (local_258 <= local_2b8)) {
            pbVar8 = local_280 + local_2d0;
            if (local_2c0 < 0x10) {
              local_58 = local_280;
              local_70 = local_2c0;
              local_68 = pbVar8;
              local_60 = local_2b8;
              if (local_2c0 == 1) {
                memset(&local_78,(uint)*local_2b8,8);
              }
              else if (local_2c0 == 2) {
                local_78 = *(undefined2 *)local_2b8;
                uStack_76 = *(undefined2 *)local_2b8;
                uStack_74 = CONCAT22(uStack_76,local_78);
              }
              else {
                if (local_2c0 != 4) {
                  local_38 = local_280;
                  local_50 = local_2c0;
                  local_48 = pbVar8;
                  if (local_2c0 < 8) {
                    local_40 = local_2b8;
                    LZ4_write32(local_280,0);
                    *local_38 = *local_40;
                    local_38[1] = local_40[1];
                    local_38[2] = local_40[2];
                    local_38[3] = local_40[3];
                    uVar1 = inc32table[local_50];
                    *(undefined4 *)(local_38 + 4) = *(undefined4 *)(local_40 + uVar1);
                    local_40 = local_40 + uVar1 + -(long)dec64table[local_50];
                  }
                  else {
                    *(undefined8 *)local_280 = *(undefined8 *)local_2b8;
                    local_40 = local_2b8 + 8;
                  }
                  local_38 = local_38 + 8;
                  local_8 = local_38;
                  local_10 = local_40;
                  local_18 = local_48;
                  local_20 = local_38;
                  local_28 = local_40;
                  local_30 = local_48;
                  do {
                    *(undefined8 *)local_20 = *(undefined8 *)local_28;
                    local_20 = local_20 + 8;
                    local_28 = local_28 + 8;
                    local_280 = pbVar8;
                  } while (local_20 < local_48);
                  goto LAB_00219ac9;
                }
                local_78 = (undefined2)*(undefined4 *)local_2b8;
                uStack_76 = (undefined2)((uint)*(undefined4 *)local_2b8 >> 0x10);
                uStack_74 = *(undefined4 *)local_2b8;
              }
              *(ulong *)local_58 = CONCAT44(uStack_74,CONCAT22(uStack_76,local_78));
              while (local_58 = local_58 + 8, local_280 = pbVar8, local_58 < local_68) {
                *(ulong *)local_58 = CONCAT44(uStack_74,CONCAT22(uStack_76,local_78));
              }
              goto LAB_00219ac9;
            }
            local_80 = local_280;
            local_98 = local_280;
            local_a0 = local_2b8;
            do {
              *(undefined8 *)local_98 = *(undefined8 *)local_a0;
              *(undefined8 *)(local_98 + 8) = *(undefined8 *)(local_a0 + 8);
              *(undefined8 *)(local_98 + 0x10) = *(undefined8 *)(local_a0 + 0x10);
              *(undefined8 *)(local_98 + 0x18) = *(undefined8 *)(local_a0 + 0x18);
              local_98 = local_98 + 0x20;
              local_a0 = local_a0 + 0x20;
              local_280 = pbVar8;
              local_a8 = pbVar8;
              local_90 = pbVar8;
              local_88 = local_2b8;
            } while (local_98 < pbVar8);
            goto LAB_00219ac9;
          }
          if (pbVar4 + -5 < local_280 + local_2d0) {
            if (local_24c == 0) goto LAB_0021ba4c;
            if (local_2d0 < (ulong)((long)pbVar4 - (long)local_280)) {
              local_398 = local_2d0;
            }
            else {
              local_398 = (long)pbVar4 - (long)local_280;
            }
            local_2d0 = local_398;
          }
          if ((ulong)((long)local_258 - (long)local_2b8) < local_2d0) {
            sVar5 = (long)local_258 - (long)local_2b8;
            local_2d0 = local_2d0 - sVar5;
            memcpy(local_280,(void *)(local_388 - sVar5),sVar5);
            pbVar8 = local_280 + sVar5;
            if ((ulong)((long)pbVar8 - (long)local_258) < local_2d0) {
              local_300 = local_258;
              local_280 = pbVar8;
              while (local_280 < pbVar8 + local_2d0) {
                *local_280 = *local_300;
                local_300 = local_300 + 1;
                local_280 = local_280 + 1;
              }
            }
            else {
              memcpy(pbVar8,local_258,local_2d0);
              local_280 = pbVar8 + local_2d0;
            }
          }
          else {
            memmove(local_280,(void *)(local_388 - ((long)local_258 - (long)local_2b8)),local_2d0);
            local_280 = local_280 + local_2d0;
          }
        } while( true );
      }
LAB_0021a98f:
      local_280 = pbVar8;
      pbVar8 = local_270 + 1;
      local_2c4 = (uint)*local_270;
      local_2d0 = (ulong)(*local_270 >> 4);
      if ((local_2d0 == 0xf) || (pbVar3 + -0x10 <= pbVar8 || pbVar4 + -0x20 < local_280)) {
        if (local_2d0 == 0xf) {
          local_f0 = pbVar3 + -0xf;
          local_e8 = &local_270;
          local_f4 = 1;
          local_108 = 0;
          if (pbVar8 < local_f0) {
            local_108 = (ulong)*pbVar8;
            local_270 = local_270 + 2;
            local_100 = local_108;
            if (local_f0 < local_270) {
              local_e0 = 0xffffffffffffffff;
            }
            else {
              local_e0 = local_108;
              if (local_108 == 0xff) {
                local_108 = 0xff;
                do {
                  local_100 = (ulong)**local_e8;
                  *local_e8 = *local_e8 + 1;
                  local_108 = local_100 + local_108;
                  if (local_f0 < *local_e8) {
                    local_e0 = 0xffffffffffffffff;
                    break;
                  }
                  local_e0 = local_108;
                } while (local_100 == 0xff);
              }
            }
          }
          else {
            local_e0 = 0xffffffffffffffff;
            local_270 = pbVar8;
          }
          if (((local_e0 == 0xffffffffffffffff) ||
              (local_2d0 = local_e0 + 0xf, local_280 + local_2d0 < local_280)) ||
             (pbVar8 = local_270, local_270 + local_2d0 < local_270)) {
LAB_0021ba4c:
            return -1 - ((int)local_270 - (int)local_238);
          }
        }
LAB_0021ad96:
        local_270 = pbVar8;
        local_290 = local_280 + local_2d0;
        if ((pbVar4 + -0xc < local_290) || (pbVar3 + -8 < local_270 + local_2d0)) {
          if (local_24c == 0) {
            if ((local_270 + local_2d0 != pbVar3) || (pbVar4 < local_290)) goto LAB_0021ba4c;
          }
          else {
            if (pbVar3 < local_270 + local_2d0) {
              local_2d0 = (long)pbVar3 - (long)local_270;
              local_290 = local_280 + local_2d0;
            }
            if (pbVar4 < local_290) {
              local_2d0 = (long)pbVar4 - (long)local_280;
              local_290 = pbVar4;
            }
          }
          memmove(local_280,local_270,local_2d0);
          local_270 = local_270 + local_2d0;
          local_280 = local_280 + local_2d0;
          if (((local_24c == 0) || (local_290 == pbVar4)) || (pbVar3 + -2 <= local_270))
          goto LAB_0021ba30;
        }
        else {
          local_1a0 = local_280;
          local_1a8 = local_270;
          local_1b8 = local_280;
          local_1c0 = local_270;
          do {
            *(undefined8 *)local_1b8 = *(undefined8 *)local_1c0;
            local_1b8 = local_1b8 + 8;
            local_1c0 = local_1c0 + 8;
          } while (local_1b8 < local_290);
          local_270 = local_270 + local_2d0;
          local_280 = local_290;
          local_1c8 = local_290;
          local_1b0 = local_290;
        }
        UVar2 = LZ4_readLE16(in_stack_fffffffffffffc48);
        local_2c0 = (ulong)UVar2;
        local_270 = local_270 + 2;
        local_2b8 = local_280 + -local_2c0;
        local_2d0 = (ulong)(local_2c4 & 0xf);
      }
      else {
        *(undefined8 *)local_280 = *(undefined8 *)pbVar8;
        *(undefined8 *)(local_280 + 8) = *(undefined8 *)(local_270 + 9);
        local_280 = local_280 + local_2d0;
        local_270 = pbVar8 + local_2d0;
        local_2d0 = (ulong)(local_2c4 & 0xf);
        UVar2 = LZ4_readLE16(in_stack_fffffffffffffc48);
        local_2c0 = (ulong)UVar2;
        local_270 = local_270 + 2;
        local_2b8 = local_280 + -local_2c0;
        if (((local_2d0 != 0xf) && (7 < local_2c0)) &&
           ((local_250 == 1 || (local_258 <= local_2b8)))) {
          *(undefined8 *)local_280 = *(undefined8 *)local_2b8;
          *(undefined8 *)(local_280 + 8) = *(undefined8 *)(local_2b8 + 8);
          *(undefined2 *)(local_280 + 0x10) = *(undefined2 *)(local_2b8 + 0x10);
          pbVar8 = local_280 + local_2d0 + 4;
          goto LAB_0021a98f;
        }
      }
      if (local_2d0 == 0xf) {
        local_120 = pbVar3 + -4;
        local_118 = &local_270;
        local_124 = 0;
        local_138 = (ulong)*local_270;
        local_270 = local_270 + 1;
        local_130 = local_138;
        if (local_120 < local_270) {
          local_110 = 0xffffffffffffffff;
        }
        else {
          local_110 = local_138;
          if (local_138 == 0xff) {
            local_138 = 0xff;
            do {
              local_130 = (ulong)**local_118;
              *local_118 = *local_118 + 1;
              local_138 = local_130 + local_138;
              if (local_120 < *local_118) {
                local_110 = 0xffffffffffffffff;
                break;
              }
              local_110 = local_138;
            } while (local_130 == 0xff);
          }
        }
        if ((local_110 == 0xffffffffffffffff) ||
           (local_2d0 = local_110 + 0xf, local_280 + local_2d0 < local_280)) goto LAB_0021ba4c;
      }
      local_2d0 = local_2d0 + 4;
LAB_0021b297:
      if ((in_stack_00000008 < 0x10000) && (local_2b8 + local_268 < local_258)) goto LAB_0021ba4c;
      if ((local_250 == 2) && (local_2b8 < local_258)) {
        if (pbVar4 + -5 < local_280 + local_2d0) {
          if (local_24c == 0) goto LAB_0021ba4c;
          if (local_2d0 < (ulong)((long)pbVar4 - (long)local_280)) {
            local_3a8 = local_2d0;
          }
          else {
            local_3a8 = (long)pbVar4 - (long)local_280;
          }
          local_2d0 = local_3a8;
        }
        if ((ulong)((long)local_258 - (long)local_2b8) < local_2d0) {
          sVar5 = (long)local_258 - (long)local_2b8;
          local_2d0 = local_2d0 - sVar5;
          memcpy(local_280,(void *)(local_388 - sVar5),sVar5);
          pbVar6 = local_280 + sVar5;
          if ((ulong)((long)pbVar6 - (long)local_258) < local_2d0) {
            local_330 = local_258;
            local_280 = pbVar6;
            while (pbVar8 = local_280, local_280 < pbVar6 + local_2d0) {
              *local_280 = *local_330;
              local_330 = local_330 + 1;
              local_280 = local_280 + 1;
            }
          }
          else {
            memcpy(pbVar6,local_258,local_2d0);
            pbVar8 = pbVar6 + local_2d0;
          }
        }
        else {
          memmove(local_280,(void *)(local_388 - ((long)local_258 - (long)local_2b8)),local_2d0);
          pbVar8 = local_280 + local_2d0;
        }
        goto LAB_0021a98f;
      }
      pbVar8 = local_280 + local_2d0;
      if ((local_24c == 0) || (pbVar8 <= pbVar4 + -0xc)) {
        if (local_2c0 < 8) {
          LZ4_write32(local_280,0);
          *local_280 = *local_2b8;
          local_280[1] = local_2b8[1];
          local_280[2] = local_2b8[2];
          local_280[3] = local_2b8[3];
          uVar1 = inc32table[local_2c0];
          *(undefined4 *)(local_280 + 4) = *(undefined4 *)(local_2b8 + uVar1);
          local_2b8 = local_2b8 + uVar1 + -(long)dec64table[local_2c0];
        }
        else {
          *(undefined8 *)local_280 = *(undefined8 *)local_2b8;
          local_2b8 = local_2b8 + 8;
        }
        pbVar6 = local_280 + 8;
        if (pbVar4 + -0xc < pbVar8) {
          pbVar7 = pbVar4 + -7;
          if (pbVar4 + -5 < pbVar8) goto LAB_0021ba4c;
          local_280 = pbVar6;
          if (pbVar6 < pbVar7) {
            local_208 = local_2b8;
            local_220 = local_2b8;
            local_218 = pbVar6;
            do {
              *(undefined8 *)local_218 = *(undefined8 *)local_220;
              local_218 = local_218 + 8;
              local_220 = local_220 + 8;
            } while (local_218 < pbVar7);
            local_2b8 = local_2b8 + ((long)pbVar7 - (long)pbVar6);
            local_280 = pbVar7;
            local_200 = pbVar6;
            local_210 = pbVar7;
            local_228 = pbVar7;
          }
          while (local_280 < pbVar8) {
            *local_280 = *local_2b8;
            local_2b8 = local_2b8 + 1;
            local_280 = local_280 + 1;
          }
        }
        else {
          *(undefined8 *)pbVar6 = *(undefined8 *)local_2b8;
          if (0x10 < local_2d0) {
            local_1d0 = local_280 + 0x10;
            local_1d8 = local_2b8 + 8;
            local_1f0 = local_1d8;
            local_1e8 = local_1d0;
            do {
              *(undefined8 *)local_1e8 = *(undefined8 *)local_1f0;
              local_1e8 = local_1e8 + 8;
              local_1f0 = local_1f0 + 8;
              local_1f8 = pbVar8;
              local_1e0 = pbVar8;
            } while (local_1e8 < pbVar8);
          }
        }
        goto LAB_0021a98f;
      }
      if (local_2d0 < (ulong)((long)pbVar4 - (long)local_280)) {
        local_3b0 = local_2d0;
      }
      else {
        local_3b0 = (long)pbVar4 - (long)local_280;
      }
      pbVar8 = local_280 + local_3b0;
      if (local_280 < local_2b8 + local_3b0) {
        while (local_280 < pbVar8) {
          *local_280 = *local_2b8;
          local_2b8 = local_2b8 + 1;
          local_280 = local_280 + 1;
        }
      }
      else {
        memcpy(local_280,local_2b8,local_3b0);
      }
      local_280 = pbVar8;
      if (pbVar8 != pbVar4) goto LAB_0021a98f;
LAB_0021ba30:
      local_22c = (int)local_280 - (int)local_240;
    }
  }
  return local_22c;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}